

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad_test.cc
# Opt level: O0

void __thiscall
(anonymous_namespace)::SADx3Test_ShortRef_Test::~SADx3Test_ShortRef_Test
          (SADx3Test_ShortRef_Test *this)

{
  SADx3Test_ShortRef_Test *in_stack_00000010;
  
  anon_unknown.dwarf_14174cb::SADx3Test_ShortRef_Test::~SADx3Test_ShortRef_Test(in_stack_00000010);
  return;
}

Assistant:

TEST_P(SADx3Test, ShortRef) {
  int tmp_stride = reference_stride_;
  reference_stride_ >>= 1;
  FillRandom(source_data_, source_stride_);
  FillRandom(GetReference(0), reference_stride_);
  FillRandom(GetReference(1), reference_stride_);
  FillRandom(GetReference(2), reference_stride_);
  FillRandom(GetReference(3), reference_stride_);
  CheckSADs();
  reference_stride_ = tmp_stride;
}